

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O0

void __thiscall camp::TagHolder::TagHolder(TagHolder *this)

{
  TagHolder *this_local;
  
  this->_vptr_TagHolder = (_func_int **)&PTR__TagHolder_001fd140;
  std::
  map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
  ::map(&this->m_tags);
  return;
}

Assistant:

TagHolder::TagHolder()
{
}